

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

Matrix<std::complex<float>_> * __thiscall
webrtc::Matrix<std::complex<float>_>::Add
          (Matrix<std::complex<float>_> *this,Matrix<std::complex<float>_> *operand)

{
  float fVar1;
  float fVar2;
  pointer pcVar3;
  string *result;
  pointer pcVar4;
  ulong uVar5;
  int line;
  FatalMessage FStack_188;
  
  if (this->num_rows_ == operand->num_rows_) {
    result = (string *)0x0;
  }
  else {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&this->num_rows_,&operand->num_rows_,"num_rows_ == operand.num_rows_");
  }
  if (result == (string *)0x0) {
    if (this->num_columns_ == operand->num_columns_) {
      result = (string *)0x0;
    }
    else {
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         (&this->num_columns_,&operand->num_columns_,
                          "num_columns_ == operand.num_columns_");
    }
    if (result == (string *)0x0) {
      pcVar4 = (this->data_).
               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->data_).
          super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar4) {
        uVar5 = 0;
        do {
          pcVar3 = (operand->data_).
                   super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          fVar1 = *(float *)((long)&pcVar3[uVar5]._M_value + 4);
          fVar2 = *(float *)((long)&pcVar4[uVar5]._M_value + 4);
          *(float *)&pcVar4[uVar5]._M_value =
               *(float *)&pcVar3[uVar5]._M_value + *(float *)&pcVar4[uVar5]._M_value;
          *(float *)((long)&pcVar4[uVar5]._M_value + 4) = fVar1 + fVar2;
          uVar5 = uVar5 + 1;
          pcVar4 = (this->data_).
                   super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (uVar5 < (ulong)((long)(this->data_).
                                       super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar4 >>
                                3));
      }
      return this;
    }
    line = 0xa3;
  }
  else {
    line = 0xa2;
  }
  rtc::FatalMessage::FatalMessage
            (&FStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/matrix.h"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&FStack_188);
}

Assistant:

Matrix& Add(const Matrix& operand) {
    RTC_CHECK_EQ(num_rows_, operand.num_rows_);
    RTC_CHECK_EQ(num_columns_, operand.num_columns_);

    for (size_t i = 0; i < data_.size(); ++i) {
      data_[i] += operand.data_[i];
    }

    return *this;
  }